

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

bool IsProxy(CNetAddr *addr)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  Proxy *pPVar4;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock10;
  unique_lock<std::mutex> uStack_68;
  CNetAddr local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)&uStack_68,&g_proxyinfo_mutex,"g_proxyinfo_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
             ,0x2d0,false);
  pPVar4 = proxyInfo;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 7) break;
    CNetAddr::CNetAddr(&local_58,(CNetAddr *)pPVar4);
    bVar2 = operator==(addr,&local_58);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58.m_addr);
    pPVar4 = pPVar4 + 1;
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar3 < 7;
  }
  __stack_chk_fail();
}

Assistant:

bool IsProxy(const CNetAddr &addr) {
    LOCK(g_proxyinfo_mutex);
    for (int i = 0; i < NET_MAX; i++) {
        if (addr == static_cast<CNetAddr>(proxyInfo[i].proxy))
            return true;
    }
    return false;
}